

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void print_dict(ObjDict *dict,_Bool new_line)

{
  HTKeyType HVar1;
  uint uVar2;
  HTItem **ppHVar3;
  HTItem *pHVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  char *pcVar6;
  table_item_t **pptVar7;
  char *pcVar8;
  bool bVar9;
  CrispyValue value;
  
  pcVar6 = "\n";
  bVar9 = (int)CONCAT71(in_register_00000031,new_line) == 0;
  if (bVar9) {
    pcVar6 = "";
  }
  pcVar8 = "\t";
  if (bVar9) {
    pcVar8 = "";
  }
  HVar1 = (dict->content).key_type;
  uVar2 = (dict->content).cap;
  ppHVar3 = (dict->content).buckets;
  printf("{%s");
  bVar9 = true;
  uVar5 = 0;
  do {
    if (uVar5 == uVar2) {
      printf("}%s",pcVar6);
      return;
    }
    pptVar7 = ppHVar3 + uVar5;
    while (pHVar4 = *pptVar7, pHVar4 != (HTItem *)0x0) {
      if (!bVar9) {
        printf(", ");
      }
      printf("%s\"",pcVar8);
      if (HVar1 < 4) {
        (*(code *)(&DAT_001073b8 + *(int *)(&DAT_001073b8 + (ulong)HVar1 * 4)))();
        return;
      }
      bVar9 = false;
      printf("\": ");
      value._4_4_ = 0;
      value.type = (pHVar4->value).type;
      value.field_1.p_value = (pHVar4->value).field_1.p_value;
      print_value(value,new_line,true);
      pptVar7 = &pHVar4->next;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void print_dict(ObjDict *dict, bool new_line) {
    const char *nl = (new_line) ? "\n" : "";
    const char *tab = (new_line) ? "\t" : "";

    HashTable ht = dict->content;

    printf("{%s", nl);
    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
            } else {
                printf(", ");
            }
            printf("%s\"", tab);
            print_ht_key(ht.key_type, bucket->key);
            printf("\": ");
            print_value(bucket->value, new_line, true);

            bucket = bucket->next;
        }
    }

    printf("}%s", nl);
}